

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

PackedSlice * __thiscall
kratos::VarPackedStruct::operator[](VarPackedStruct *this,string *member_name)

{
  uint32_t uVar1;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  UserException *this_00;
  element_type *peVar2;
  char (*format_str) [50];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_00;
  format_args args_00;
  VarPackedStruct *local_100;
  undefined1 local_f8 [8];
  shared_ptr<kratos::PackedSlice> ptr;
  v7 local_d8 [32];
  string local_b8;
  string *local_98;
  string *member_name_local;
  VarPackedStruct *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_98 = member_name;
  member_name_local = (string *)this;
  uVar1 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
  args = (remove_reference_t<std::__cxx11::basic_string<char>_> *)Var::var_width(&this->super_Var);
  if (uVar1 != *(uint32_t *)args) {
    ptr.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_
         = 1;
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_d8);
    local_38 = &local_b8;
    local_40 = "Unable to access member of {0}, which is an array";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_d8;
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[50],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"Unable to access member of {0}, which is an array",(v7 *)vargs,format_str,
                    args);
    local_50 = &local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    format_str_00.size_ = (size_t)this_local;
    format_str_00.data_ = (char *)local_78.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_80.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)local_78.data_,format_str_00,args_00);
    UserException::UserException(this_00,&local_b8);
    ptr.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_
         = 0;
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  local_100 = this;
  std::make_shared<kratos::PackedSlice,kratos::VarPackedStruct*,std::__cxx11::string_const&>
            ((VarPackedStruct **)local_f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
  std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
  emplace_back<std::shared_ptr<kratos::PackedSlice>&>
            ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
              *)&(this->super_Var).slices_,(shared_ptr<kratos::PackedSlice> *)local_f8);
  peVar2 = std::__shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_f8);
  std::shared_ptr<kratos::PackedSlice>::~shared_ptr((shared_ptr<kratos::PackedSlice> *)local_f8);
  return peVar2;
}

Assistant:

PackedSlice &VarPackedStruct::operator[](const std::string &member_name) {
    if (width() != var_width())
        throw UserException(
            ::format("Unable to access member of {0}, which is an array", to_string()));
    auto ptr = std::make_shared<PackedSlice>(this, member_name);
    slices_.emplace_back(ptr);
    return *ptr;
}